

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O0

void slang::SFormat::formatStrength(string *result,SVInt *value)

{
  logic_error *this;
  string local_f8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint8_t local_1d;
  bitwidth_t local_1c;
  logic_t l;
  SVInt *pSStack_18;
  bitwidth_t i;
  SVInt *value_local;
  string *result_local;
  
  pSStack_18 = value;
  local_1c = SVInt::getBitWidth(value);
  do {
    if (local_1c == 0) {
      return;
    }
    local_1d = (uint8_t)SVInt::operator[](pSStack_18,local_1c - 1);
    if (local_1d == '\0') {
      std::__cxx11::string::operator+=((string *)result,"St0");
    }
    else if (local_1d == '\x01') {
      std::__cxx11::string::operator+=((string *)result,"St1");
    }
    else if (local_1d == '@') {
      std::__cxx11::string::operator+=((string *)result,"HiZ");
    }
    else {
      if (local_1d != 0x80) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SFormat.cpp"
                   ,&local_c1);
        std::operator+(&local_a0,&local_c0,":");
        std::__cxx11::to_string(&local_f8,0x15a);
        std::operator+(&local_80,&local_a0,&local_f8);
        std::operator+(&local_60,&local_80,": ");
        std::operator+(&local_40,&local_60,"Default case should be unreachable!");
        std::logic_error::logic_error(this,(string *)&local_40);
        __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::operator+=((string *)result,"StX");
    }
    if (local_1c != 1) {
      std::__cxx11::string::operator+=((string *)result," ");
    }
    local_1c = local_1c - 1;
  } while( true );
}

Assistant:

void formatStrength(std::string& result, const SVInt& value) {
    for (bitwidth_t i = value.getBitWidth(); i > 0; i--) {
        // At compile time it's impossible to know strength values so
        // we will always put "Strong" here, or "Hi" if it's high impedance.
        logic_t l = value[int32_t(i) - 1];
        switch (l.value) {
            case 0:
                result += "St0";
                break;
            case 1:
                result += "St1";
                break;
            case logic_t::X_VALUE:
                result += "StX";
                break;
            case logic_t::Z_VALUE:
                result += "HiZ";
                break;
            default:
                ASSUME_UNREACHABLE;
        }

        if (i != 1)
            result += " ";
    }
}